

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O1

void __thiscall FParser::SF_Pow(FParser *this)

{
  double dVar1;
  double __y;
  
  if (1 < this->t_argc) {
    dVar1 = floatvalue(this->t_argv);
    __y = floatvalue(this->t_argv + 1);
    dVar1 = pow(dVar1,__y);
    (this->t_return).value.i = (int)(dVar1 * 65536.0);
    (this->t_return).type = 6;
    return;
  }
  script_error("Insufficient parameters for \'%s\'\n",(this->t_func).Chars);
  return;
}

Assistant:

void FParser::SF_Pow()
{
	if (CheckArgs(2))
	{
		t_return.setDouble(pow(floatvalue(t_argv[0]), floatvalue(t_argv[1])));
	}
}